

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O1

void Rwr_ScoresClean(Rwr_Man_t *p)

{
  void **ppvVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar5 = (long)p->vClasses->nSize;
  if (0 < lVar5) {
    ppvVar1 = p->vClasses->pArray;
    lVar6 = 0;
    do {
      pvVar2 = ppvVar1[lVar6];
      lVar7 = (long)*(int *)((long)pvVar2 + 4);
      if (0 < lVar7) {
        lVar3 = *(long *)((long)pvVar2 + 8);
        lVar8 = 0;
        do {
          lVar4 = *(long *)(lVar3 + lVar8 * 8);
          *(undefined2 *)(lVar4 + 0xc) = 0;
          *(undefined4 *)(lVar4 + 8) = 0;
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
  }
  return;
}

Assistant:

void Rwr_ScoresClean( Rwr_Man_t * p )
{
    Vec_Ptr_t * vSubgraphs;
    Rwr_Node_t * pNode;
    int i, k;
    for ( i = 0; i < p->vClasses->nSize; i++ )
    {
        vSubgraphs = Vec_VecEntry( p->vClasses, i );
        Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, k )
            pNode->nScore = pNode->nGain = pNode->nAdded = 0;
    }
}